

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O0

void __thiscall
txpackage_tests::noncontextual_package_tests::test_method(noncontextual_package_tests *this)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_04;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_05;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_07;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_08;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_09;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_10;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_11;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_12;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_13;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_14;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_15;
  bool bVar2;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_ffffffffffffdfa8;
  CKey *this_00;
  FastRandomContext *this_01;
  PKHash *in_stack_ffffffffffffdfb0;
  CMutableTransaction *txIn;
  char *this_02;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_ffffffffffffdfb8;
  uint uVar4;
  char *this_03;
  COutPoint *in_stack_ffffffffffffdfc0;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffdfc8;
  CKey *in_stack_ffffffffffffdfd0;
  const_iterator in_stack_ffffffffffffdfd8;
  const_string *in_stack_ffffffffffffdfe0;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffdfe8;
  iterator in_stack_ffffffffffffdff0;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffdff8;
  FastRandomContext *in_stack_ffffffffffffe010;
  Package *in_stack_ffffffffffffe038;
  const_iterator in_stack_ffffffffffffe048;
  __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  in_stack_ffffffffffffe060;
  __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  in_stack_ffffffffffffe068;
  undefined1 *puVar5;
  undefined1 in_stack_ffffffffffffe0f7;
  string *in_stack_ffffffffffffe0f8;
  PackageValidationState *in_stack_ffffffffffffe100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1ef8;
  undefined1 in_stack_ffffffffffffe13f;
  CKey *in_stack_ffffffffffffe140;
  string *psVar6;
  undefined8 in_stack_ffffffffffffe148;
  string *psVar7;
  CTransactionRef *in_stack_ffffffffffffe150;
  TestChain100Setup *in_stack_ffffffffffffe158;
  string *local_1e68;
  string *local_1e20;
  string *local_1dd8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d90;
  undefined7 in_stack_ffffffffffffe2e0;
  undefined1 in_stack_ffffffffffffe2e7;
  CAmount in_stack_ffffffffffffe2e8;
  byte *local_1b18;
  array<std::byte,_64UL> *local_1b00;
  undefined1 *local_1aa0;
  undefined1 *local_1a88;
  undefined1 *local_1a28;
  undefined1 *local_1a10;
  undefined1 *local_19b8;
  undefined1 *local_1970;
  string *local_18f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_18b0;
  int i;
  noncontextual_package_tests *this_local;
  undefined1 local_16f8 [16];
  undefined1 local_16e8 [64];
  ValidationState<PackageValidationResult> local_16a8;
  const_string local_1650 [2];
  lazy_ostream local_1630 [4];
  assertion_result local_15f0 [2];
  const_string local_15b8 [2];
  lazy_ostream local_1598 [4];
  assertion_result local_1558 [2];
  const_string local_1520 [2];
  lazy_ostream local_1500 [4];
  assertion_result local_14c0 [2];
  const_string local_1488 [2];
  lazy_ostream local_1468 [4];
  assertion_result local_1428 [2];
  const_string local_13f0 [2];
  lazy_ostream local_13d0 [4];
  assertion_result local_1390 [2];
  const_string local_1358 [2];
  lazy_ostream local_1338 [4];
  assertion_result local_12f8 [2];
  const_string local_12c0 [2];
  lazy_ostream local_12a0 [4];
  assertion_result local_1260 [2];
  CTransactionRef tx_child_1;
  CMutableTransaction mtx_child_1;
  CTransactionRef tx_parent_also_child;
  CMutableTransaction mtx_parent_also_child;
  CTransactionRef tx_parent_1;
  CMutableTransaction mtx_parent_1;
  const_string local_1130 [2];
  lazy_ostream local_1110 [2];
  assertion_result local_10f0 [2];
  shared_ptr<const_CTransaction> *local_10b8;
  const_string local_10a8 [2];
  lazy_ostream local_1088 [2];
  assertion_result local_1068 [2];
  shared_ptr<const_CTransaction> *local_1030;
  const_string local_1020 [2];
  lazy_ostream local_1000 [2];
  assertion_result local_fe0 [2];
  const_string local_fa8 [2];
  lazy_ostream local_f88 [2];
  assertion_result local_f68 [2];
  const_string local_f30 [2];
  lazy_ostream local_f10 [2];
  assertion_result local_ef0 [3];
  const_string local_ea8 [2];
  lazy_ostream local_e88 [2];
  assertion_result local_e68 [2];
  undefined1 *local_e30;
  CTransactionRef parent;
  CMutableTransaction child;
  Package package;
  const_string local_d70 [2];
  lazy_ostream local_d50 [6];
  assertion_result local_cf0 [2];
  const_string local_cb8 [2];
  lazy_ostream local_c98 [6];
  assertion_result local_c38 [2];
  const_string local_c00 [2];
  lazy_ostream local_be0 [6];
  assertion_result local_b80 [2];
  const_string local_b48 [2];
  lazy_ostream local_b28 [4];
  assertion_result local_ae8 [2];
  const_string local_ab0 [2];
  lazy_ostream local_a90 [4];
  assertion_result local_a50 [2];
  undefined1 local_a18 [16];
  undefined1 local_a08 [64];
  ValidationState<PackageValidationResult> local_9c8;
  const_string local_970 [2];
  lazy_ostream local_950 [4];
  assertion_result local_910 [2];
  const_string local_8d8 [2];
  lazy_ostream local_8b8 [4];
  assertion_result local_878 [2];
  CTransactionRef tx_child;
  CMutableTransaction mtx_child;
  CTransactionRef tx_parent;
  CMutableTransaction mtx_parent;
  CKey placeholder_key_2;
  CKey placeholder_key;
  undefined1 local_750 [32];
  undefined1 local_730 [48];
  undefined1 local_700 [48];
  string local_6d0;
  string local_6a0;
  string local_670;
  string local_640;
  string local_620;
  PackageValidationState state_2;
  PackageValidationState state_1;
  FastRandomContext rng;
  FastRandomContext local_430;
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [16];
  undefined1 local_310 [32];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  string local_260;
  string local_240;
  PackageValidationState state;
  undefined1 local_1d8 [232];
  CScript spk2;
  CScript spk;
  
  local_1000[0]._vptr_lazy_ostream = (_func_int **)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81((ulong)in_stack_ffffffffffffdfb0 >> 0x38,0));
  CKey::GetPubKey(in_stack_ffffffffffffdfd0);
  PKHash::PKHash((PKHash *)in_stack_ffffffffffffdfc0,(CPubKey *)in_stack_ffffffffffffdfb8);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>(in_stack_ffffffffffffdfb8,in_stack_ffffffffffffdfb0);
  GetScriptForDestination(in_stack_ffffffffffffdfa8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_ffffffffffffdfa8);
  GenerateRandomKey(SUB81((ulong)in_stack_ffffffffffffdfb0 >> 0x38,0));
  CKey::GetPubKey(in_stack_ffffffffffffdfd0);
  PKHash::PKHash((PKHash *)in_stack_ffffffffffffdfc0,(CPubKey *)in_stack_ffffffffffffdfb8);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>(in_stack_ffffffffffffdfb8,in_stack_ffffffffffffdfb0);
  GetScriptForDestination(in_stack_ffffffffffffdfa8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_ffffffffffffdfa8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffdfb8,(size_type)in_stack_ffffffffffffdfb0);
  uVar4 = (uint)((ulong)in_stack_ffffffffffffdfb8 >> 0x20);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffdfa8,
             (shared_ptr<const_CTransaction> *)0xb65ea9);
  CKey::CKey((CKey *)in_stack_ffffffffffffdfd8._M_current,in_stack_ffffffffffffdfd0);
  CScript::CScript((CScript *)in_stack_ffffffffffffdfa8,(CScript *)0xb65edc);
  txIn = (CMutableTransaction *)&DAT_124101100;
  this_00 = (CKey *)(local_1d8 + 0x20);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe158,in_stack_ffffffffffffe150,
             (uint32_t)((ulong)in_stack_ffffffffffffe148 >> 0x20),(int)in_stack_ffffffffffffe148,
             in_stack_ffffffffffffe140,
             (CScript *)CONCAT17(in_stack_ffffffffffffe2e7,in_stack_ffffffffffffe2e0),
             in_stack_ffffffffffffe2e8,(bool)in_stack_ffffffffffffe13f);
  CScript::~CScript((CScript *)this_00);
  CKey::~CKey(this_00);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  MakeTransactionRef<CMutableTransaction&>(txIn);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)this_00,(shared_ptr<const_CTransaction> *)0xb65f81);
  CKey::CKey((CKey *)in_stack_ffffffffffffdfd8._M_current,in_stack_ffffffffffffdfd0);
  CScript::CScript((CScript *)this_00,(CScript *)0xb65fad);
  this_02 = &DAT_11e1a3000;
  this_01 = (FastRandomContext *)local_1d8;
  this_03 = (char *)((ulong)uVar4 << 0x20);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe158,in_stack_ffffffffffffe150,
             (uint32_t)((ulong)in_stack_ffffffffffffe148 >> 0x20),(int)in_stack_ffffffffffffe148,
             in_stack_ffffffffffffe140,
             (CScript *)CONCAT17(in_stack_ffffffffffffe2e7,in_stack_ffffffffffffe2e0),
             in_stack_ffffffffffffe2e8,(bool)in_stack_ffffffffffffe13f);
  CScript::~CScript((CScript *)this_01);
  CKey::~CKey((CKey *)this_01);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_02);
  PackageValidationState::PackageValidationState((PackageValidationState *)this_01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb660c6)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb660db)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsWellFormedPackage((Package *)in_stack_ffffffffffffe100,
                        (PackageValidationState *)in_stack_ffffffffffffe0f8,
                        (bool)in_stack_ffffffffffffe0f7);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_878,local_8b8,local_8d8,0x115,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_18b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&state;
    do {
      local_18b0 = &((string *)(local_18b0 + -2))->field_2;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while ((string *)local_18b0 != &local_240);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb66333)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb66348)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_00._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_00._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_00,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsWellFormedPackage((Package *)in_stack_ffffffffffffe100,
                        (PackageValidationState *)in_stack_ffffffffffffe0f8,
                        (bool)in_stack_ffffffffffffe0f7);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_910,local_950,local_970,0x116,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_18f8 = &local_240;
    do {
      local_18f8 = (string *)&local_18f8[-1].field_2;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_18f8 != &local_260);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    local_9c8.m_result =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)this_01);
    local_9c8.m_mode = M_INVALID;
    this_03 = "PackageValidationResult::PCKG_POLICY";
    this_02 = (char *)&local_9c8;
    this_01 = (FastRandomContext *)0x1cc5952;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_9c8.m_reject_reason.field_2,&local_9c8.m_reject_reason,0x117,1,2,
               &local_9c8.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)this_02);
    this_03 = "\"package-not-sorted\"";
    this_02 = "package-not-sorted";
    this_01 = (FastRandomContext *)0x1cc4888;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
              (local_a08,local_a18,0x118,1,2,local_280);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb66840)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb66855)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_01._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_01._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_01,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsChildWithParents((Package *)in_stack_ffffffffffffe060._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a50,local_a90,local_ab0,0x119,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1970 = local_280;
    do {
      local_1970 = local_1970 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_1970 != local_2a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb66aa0)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb66ab5)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_02._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_02._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_02,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsChildWithParentsTree(in_stack_ffffffffffffe038);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ae8,local_b28,local_b48,0x11a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_19b8 = local_2a0;
    do {
      local_19b8 = local_19b8 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_19b8 != local_2c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb66d00)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_03._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_03._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_03,(allocator_type *)in_stack_ffffffffffffdfe0);
    GetPackageHash(in_stack_ffffffffffffe038);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb66d8c)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_04._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_04._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_04,(allocator_type *)in_stack_ffffffffffffdfe0);
    GetPackageHash(in_stack_ffffffffffffe038);
    ::operator!=((base_blob<256U> *)this_03,(base_blob<256U> *)this_02);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b80,local_be0,local_c00,0x11b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1a10 = local_310;
    do {
      local_1a10 = local_1a10 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_1a10 != local_320);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1a28 = local_2e0;
    do {
      local_1a28 = local_1a28 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_1a28 != local_2f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6706a)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6707f)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_05._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_05._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_05,(allocator_type *)in_stack_ffffffffffffdfe0);
    GetPackageHash(in_stack_ffffffffffffe038);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6710b)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_06._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_06._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_06,(allocator_type *)in_stack_ffffffffffffdfe0);
    GetPackageHash(in_stack_ffffffffffffe038);
    ::operator!=((base_blob<256U> *)this_03,(base_blob<256U> *)this_02);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c38,local_c98,local_cb8,0x11c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1a88 = local_380;
    do {
      local_1a88 = local_1a88 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_1a88 != local_390);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1aa0 = local_340;
    do {
      local_1aa0 = local_1aa0 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_1aa0 != local_360);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb673e1)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb673f6)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_07._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_07._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_07,(allocator_type *)in_stack_ffffffffffffdfe0);
    GetPackageHash(in_stack_ffffffffffffe038);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6748a)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6749f)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_08._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_08._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_08,(allocator_type *)in_stack_ffffffffffffdfe0);
    GetPackageHash(in_stack_ffffffffffffe038);
    ::operator!=((base_blob<256U> *)this_03,(base_blob<256U> *)this_02);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cf0,local_d50,local_d70,0x11d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1b00 = &local_430.rng.m_buffer;
    do {
      local_1b00 = (array<std::byte,_64UL> *)((long)(local_1b00 + -1) + 0x30);
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_1b00 != (array<std::byte,_64UL> *)(local_430.rng.m_aligned.input + 4));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1b18 = (byte *)&local_430.rng.m_bufleft;
    do {
      local_1b18 = local_1b18 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_1b18 != local_430.rng.m_buffer._M_elems + 0x20);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PackageValidationState::~PackageValidationState((PackageValidationState *)this_01);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_01);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_01);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)this_01);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)this_01);
  for (i = 0; i < 0x18; i = i + 1) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)this_03,(size_type)this_02);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6779f)
    ;
    CKey::CKey((CKey *)in_stack_ffffffffffffdfd8._M_current,in_stack_ffffffffffffdfd0);
    CScript::CScript((CScript *)this_01,(CScript *)0xb677d2);
    this_02 = &DAT_11e1a3000;
    this_01 = &local_430;
    this_03 = (char *)((ulong)this_03 & 0xffffffff00000000);
    TestChain100Setup::CreateValidMempoolTransaction
              (in_stack_ffffffffffffe158,in_stack_ffffffffffffe150,
               (uint32_t)((ulong)in_stack_ffffffffffffe148 >> 0x20),(int)in_stack_ffffffffffffe148,
               in_stack_ffffffffffffe140,
               (CScript *)CONCAT17(in_stack_ffffffffffffe2e7,in_stack_ffffffffffffe2e0),
               in_stack_ffffffffffffe2e8,(bool)in_stack_ffffffffffffe13f);
    ::MakeTransactionRef<CMutableTransaction>((CMutableTransaction *)this_02);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_01);
    CScript::~CScript((CScript *)this_01);
    CKey::~CKey((CKey *)this_01);
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>&>
              ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffdfc8,
               (shared_ptr<const_CTransaction> *)in_stack_ffffffffffffdfc0);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_01);
    CTransaction::GetHash((CTransaction *)this_01);
    COutPoint::COutPoint((COutPoint *)this_03,(Txid *)this_02,(uint32_t)((ulong)this_01 >> 0x20));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
              (in_stack_ffffffffffffdfc8,in_stack_ffffffffffffdfc0);
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  }
  local_e30 = &DAT_118244f00;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffdfc8,
             (long *)in_stack_ffffffffffffdfc0,(CScript *)this_03);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    IsChildWithParents((Package *)in_stack_ffffffffffffe060._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e68,local_e88,local_ea8,0x12d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FastRandomContext::FastRandomContext((FastRandomContext *)this_03,SUB81((ulong)this_02 >> 0x38,0))
  ;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)this_02);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)this_02);
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,FastRandomContext&>
            (in_stack_ffffffffffffe068,in_stack_ffffffffffffe060,in_stack_ffffffffffffe010);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_02);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_01,(value_type *)0xb6873f);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  PackageValidationState::PackageValidationState((PackageValidationState *)this_01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    IsWellFormedPackage((Package *)in_stack_ffffffffffffe100,
                        (PackageValidationState *)in_stack_ffffffffffffe0f8,
                        (bool)in_stack_ffffffffffffe0f7);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ef0,local_f10,local_f30,0x135,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    IsChildWithParents((Package *)in_stack_ffffffffffffe060._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f68,local_f88,local_fa8,0x136,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    IsChildWithParentsTree(in_stack_ffffffffffffe038);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_fe0,local_1000,local_1020,0x137,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_1030 = (shared_ptr<const_CTransaction> *)
               std::
               vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)this_02);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
  ::__normal_iterator<std::shared_ptr<CTransaction_const>*>
            ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
              *)this_03,
             (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
              *)this_02);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::erase((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)this_03,in_stack_ffffffffffffdfd8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    IsChildWithParents((Package *)in_stack_ffffffffffffe060._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1068,local_1088,local_10a8,0x13a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_10b8 = (shared_ptr<const_CTransaction> *)
               std::
               vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)this_02);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
  ::__normal_iterator<std::shared_ptr<CTransaction_const>*>
            ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
              *)this_03,
             (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
              *)this_02);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)this_03,(size_type)this_02);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::insert(in_stack_ffffffffffffdff8,in_stack_ffffffffffffe048,in_stack_ffffffffffffdff0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    IsChildWithParents((Package *)in_stack_ffffffffffffe060._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10f0,local_1110,local_1130,0x13e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PackageValidationState::~PackageValidationState((PackageValidationState *)this_01);
  FastRandomContext::~FastRandomContext(this_01);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_01);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)this_03);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)this_01);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)this_03,(size_type)this_02);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_01);
  CTransaction::GetHash((CTransaction *)this_01);
  COutPoint::COutPoint((COutPoint *)this_03,(Txid *)this_02,(uint32_t)((ulong)this_01 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (in_stack_ffffffffffffdfc8,in_stack_ffffffffffffdfc0);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffdfc8,
             (long *)in_stack_ffffffffffffdfc0,(CScript *)this_03);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffdfc8,
             (long *)in_stack_ffffffffffffdfc0,(CScript *)this_03);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_02);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)this_01);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_01);
  CTransaction::GetHash((CTransaction *)this_01);
  COutPoint::COutPoint((COutPoint *)this_03,(Txid *)this_02,(uint32_t)((ulong)this_01 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (in_stack_ffffffffffffdfc8,in_stack_ffffffffffffdfc0);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffdfc8,
             (long *)in_stack_ffffffffffffdfc0,(CScript *)this_03);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_02);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)this_01);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_01);
  CTransaction::GetHash((CTransaction *)this_01);
  COutPoint::COutPoint((COutPoint *)this_03,(Txid *)this_02,(uint32_t)((ulong)this_01 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (in_stack_ffffffffffffdfc8,in_stack_ffffffffffffdfc0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_01);
  CTransaction::GetHash((CTransaction *)this_01);
  COutPoint::COutPoint((COutPoint *)this_03,(Txid *)this_02,(uint32_t)((ulong)this_01 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (in_stack_ffffffffffffdfc8,in_stack_ffffffffffffdfc0);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffdfc8,
             (long *)in_stack_ffffffffffffdfc0,(CScript *)this_03);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_02);
  PackageValidationState::PackageValidationState((PackageValidationState *)this_01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb692b5)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb692ca)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_09._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_09._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_09,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsChildWithParents((Package *)in_stack_ffffffffffffe060._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1260,local_12a0,local_12c0,0x155,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1d90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&state_2;
    do {
      local_1d90 = &((string *)(local_1d90 + -2))->field_2;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while ((string *)local_1d90 != &local_620);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb69515)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6952a)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_10._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_10._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_10,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsChildWithParents((Package *)in_stack_ffffffffffffe060._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_12f8,local_1338,local_1358,0x156,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1dd8 = &local_620;
    do {
      local_1dd8 = (string *)&local_1dd8[-1].field_2;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_1dd8 != &local_640);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb69775)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6978a)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6979f)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_11._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_11._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_11,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsChildWithParents((Package *)in_stack_ffffffffffffe060._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1390,local_13d0,local_13f0,0x157,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1e20 = &local_640;
    do {
      local_1e20 = (string *)&local_1e20[-1].field_2;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_1e20 != &local_670);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb699ea)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb699ff)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb69a14)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_12._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_12._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_12,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsChildWithParentsTree(in_stack_ffffffffffffe038);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1428,local_1468,local_1488,0x158,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    local_1e68 = &local_670;
    do {
      local_1e68 = (string *)&local_1e68[-1].field_2;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (local_1e68 != &local_6a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb69c61)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb69c76)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb69c8b)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_13._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_13._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_13,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsChildWithParents((Package *)in_stack_ffffffffffffe060._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_14c0,local_1500,local_1520,0x15a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    psVar7 = (string *)(local_700 + 0x30);
    psVar6 = &local_6a0;
    do {
      psVar6 = (string *)&psVar6[-1].field_2;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (psVar6 != psVar7);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb69ed6)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb69eeb)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb69f00)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_14._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_14._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_14,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsWellFormedPackage((Package *)in_stack_ffffffffffffe100,
                        (PackageValidationState *)in_stack_ffffffffffffe0f8,
                        (bool)in_stack_ffffffffffffe0f7);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1558,local_1598,local_15b8,0x15b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    in_stack_ffffffffffffe100 = (PackageValidationState *)local_700;
    local_1ef8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_700 + 0x30);
    do {
      in_stack_ffffffffffffe0f8 = (string *)(local_1ef8 + -1);
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
      local_1ef8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)in_stack_ffffffffffffe0f8;
    } while (in_stack_ffffffffffffe0f8 != (string *)in_stack_ffffffffffffe100);
    in_stack_ffffffffffffe0f7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffe0f7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6a158)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6a16d)
    ;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6a182)
    ;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    __l_15._M_len = (size_type)in_stack_ffffffffffffdff8;
    __l_15._M_array = in_stack_ffffffffffffdff0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(in_stack_ffffffffffffdfe8,__l_15,(allocator_type *)in_stack_ffffffffffffdfe0);
    IsWellFormedPackage((Package *)in_stack_ffffffffffffe100,
                        (PackageValidationState *)in_stack_ffffffffffffe0f8,
                        (bool)in_stack_ffffffffffffe0f7);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    this_01 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_15f0,local_1630,local_1650,0x15c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_03);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
    puVar5 = local_730;
    puVar3 = local_700;
    do {
      puVar3 = puVar3 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    } while (puVar3 != puVar5);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    local_16a8.m_result =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)this_01);
    local_16a8.m_mode = M_INVALID;
    this_03 = "PackageValidationResult::PCKG_POLICY";
    this_02 = (char *)&local_16a8;
    this_01 = (FastRandomContext *)0x1cc5952;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_16a8.m_reject_reason.field_2,&local_16a8.m_reject_reason,0x15d,1,2,
               &local_16a8.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,
               (size_t)in_stack_ffffffffffffdfd8._M_current,
               (const_string *)in_stack_ffffffffffffdfd0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,this_02,(unsigned_long)this_01);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)this_02);
    this_03 = "\"package-not-sorted\"";
    this_02 = "package-not-sorted";
    this_01 = (FastRandomContext *)0x1cc4888;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
              (local_16e8,local_16f8,0x15e,1,2,local_750);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PackageValidationState::~PackageValidationState((PackageValidationState *)this_01);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_01);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_01);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_01);
  CScript::~CScript((CScript *)this_01);
  CKey::~CKey((CKey *)this_01);
  CScript::~CScript((CScript *)this_01);
  CKey::~CKey((CKey *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(noncontextual_package_tests)
{
    // The signatures won't be verified so we can just use a placeholder
    CKey placeholder_key = GenerateRandomKey();
    CScript spk = GetScriptForDestination(PKHash(placeholder_key.GetPubKey()));
    CKey placeholder_key_2 = GenerateRandomKey();
    CScript spk2 = GetScriptForDestination(PKHash(placeholder_key_2.GetPubKey()));

    // Parent and Child Package
    {
        auto mtx_parent = CreateValidMempoolTransaction(m_coinbase_txns[0], 0, 0, coinbaseKey, spk,
                                                        CAmount(49 * COIN), /*submit=*/false);
        CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);

        auto mtx_child = CreateValidMempoolTransaction(tx_parent, 0, 101, placeholder_key, spk2,
                                                       CAmount(48 * COIN), /*submit=*/false);
        CTransactionRef tx_child = MakeTransactionRef(mtx_child);

        PackageValidationState state;
        BOOST_CHECK(IsWellFormedPackage({tx_parent, tx_child}, state, /*require_sorted=*/true));
        BOOST_CHECK(!IsWellFormedPackage({tx_child, tx_parent}, state, /*require_sorted=*/true));
        BOOST_CHECK_EQUAL(state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(state.GetRejectReason(), "package-not-sorted");
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_child}));
        BOOST_CHECK(IsChildWithParentsTree({tx_parent, tx_child}));
        BOOST_CHECK(GetPackageHash({tx_parent}) != GetPackageHash({tx_child}));
        BOOST_CHECK(GetPackageHash({tx_child, tx_child}) != GetPackageHash({tx_child}));
        BOOST_CHECK(GetPackageHash({tx_child, tx_parent}) != GetPackageHash({tx_child, tx_child}));
    }

    // 24 Parents and 1 Child
    {
        Package package;
        CMutableTransaction child;
        for (int i{0}; i < 24; ++i) {
            auto parent = MakeTransactionRef(CreateValidMempoolTransaction(m_coinbase_txns[i + 1],
                                             0, 0, coinbaseKey, spk, CAmount(48 * COIN), false));
            package.emplace_back(parent);
            child.vin.emplace_back(COutPoint(parent->GetHash(), 0));
        }
        child.vout.emplace_back(47 * COIN, spk2);

        // The child must be in the package.
        BOOST_CHECK(!IsChildWithParents(package));

        // The parents can be in any order.
        FastRandomContext rng;
        std::shuffle(package.begin(), package.end(), rng);
        package.push_back(MakeTransactionRef(child));

        PackageValidationState state;
        BOOST_CHECK(IsWellFormedPackage(package, state, /*require_sorted=*/true));
        BOOST_CHECK(IsChildWithParents(package));
        BOOST_CHECK(IsChildWithParentsTree(package));

        package.erase(package.begin());
        BOOST_CHECK(IsChildWithParents(package));

        // The package cannot have unrelated transactions.
        package.insert(package.begin(), m_coinbase_txns[0]);
        BOOST_CHECK(!IsChildWithParents(package));
    }

    // 2 Parents and 1 Child where one parent depends on the other.
    {
        CMutableTransaction mtx_parent;
        mtx_parent.vin.emplace_back(COutPoint(m_coinbase_txns[0]->GetHash(), 0));
        mtx_parent.vout.emplace_back(20 * COIN, spk);
        mtx_parent.vout.emplace_back(20 * COIN, spk2);
        CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);

        CMutableTransaction mtx_parent_also_child;
        mtx_parent_also_child.vin.emplace_back(COutPoint(tx_parent->GetHash(), 0));
        mtx_parent_also_child.vout.emplace_back(20 * COIN, spk);
        CTransactionRef tx_parent_also_child = MakeTransactionRef(mtx_parent_also_child);

        CMutableTransaction mtx_child;
        mtx_child.vin.emplace_back(COutPoint(tx_parent->GetHash(), 1));
        mtx_child.vin.emplace_back(COutPoint(tx_parent_also_child->GetHash(), 0));
        mtx_child.vout.emplace_back(39 * COIN, spk);
        CTransactionRef tx_child = MakeTransactionRef(mtx_child);

        PackageValidationState state;
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_parent_also_child}));
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_child}));
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_parent_also_child, tx_child}));
        BOOST_CHECK(!IsChildWithParentsTree({tx_parent, tx_parent_also_child, tx_child}));
        // IsChildWithParents does not detect unsorted parents.
        BOOST_CHECK(IsChildWithParents({tx_parent_also_child, tx_parent, tx_child}));
        BOOST_CHECK(IsWellFormedPackage({tx_parent, tx_parent_also_child, tx_child}, state, /*require_sorted=*/true));
        BOOST_CHECK(!IsWellFormedPackage({tx_parent_also_child, tx_parent, tx_child}, state, /*require_sorted=*/true));
        BOOST_CHECK_EQUAL(state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(state.GetRejectReason(), "package-not-sorted");
    }
}